

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void ecmult_const_chain_multiply(void)

{
  secp256k1_ge tmp;
  int i;
  secp256k1_ge res;
  secp256k1_gej point;
  secp256k1_gej expected_point;
  secp256k1_scalar scalar;
  secp256k1_scalar *in_stack_00000a80;
  secp256k1_ge *in_stack_00000a88;
  secp256k1_gej *in_stack_00000a90;
  secp256k1_ge *in_stack_fffffffffffffe28;
  secp256k1_gej *in_stack_fffffffffffffe30;
  secp256k1_gej *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  int iVar1;
  secp256k1_ge *in_stack_fffffffffffffea8;
  secp256k1_gej *in_stack_fffffffffffffeb0;
  undefined1 local_a0 [128];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_20 = 0x5fad0ce18fae63b;
  local_18 = 0xcd83d307827bed62;
  local_10 = 0x466abbcf34b11b6d;
  local_8 = 0x4968d5242abf9b7a;
  memcpy(local_a0,&DAT_00165d70,0x80);
  secp256k1_gej_set_ge(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  for (iVar1 = 0; iVar1 < 100; iVar1 = iVar1 + 1) {
    secp256k1_ge_set_gej
              ((secp256k1_ge *)CONCAT44(iVar1,in_stack_fffffffffffffe80),in_stack_fffffffffffffe78);
    secp256k1_ecmult_const(in_stack_00000a90,in_stack_00000a88,in_stack_00000a80);
  }
  secp256k1_ge_set_gej
            ((secp256k1_ge *)CONCAT44(iVar1,in_stack_fffffffffffffe80),in_stack_fffffffffffffe78);
  iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x11e1,"test condition failed: secp256k1_gej_eq_ge_var(&expected_point, &res)");
    abort();
  }
  return;
}

Assistant:

static void ecmult_const_chain_multiply(void) {
    /* Check known result (randomly generated test problem from sage) */
    const secp256k1_scalar scalar = SECP256K1_SCALAR_CONST(
        0x4968d524, 0x2abf9b7a, 0x466abbcf, 0x34b11b6d,
        0xcd83d307, 0x827bed62, 0x05fad0ce, 0x18fae63b
    );
    const secp256k1_gej expected_point = SECP256K1_GEJ_CONST(
        0x5494c15d, 0x32099706, 0xc2395f94, 0x348745fd,
        0x757ce30e, 0x4e8c90fb, 0xa2bad184, 0xf883c69f,
        0x5d195d20, 0xe191bf7f, 0x1be3e55f, 0x56a80196,
        0x6071ad01, 0xf1462f66, 0xc997fa94, 0xdb858435
    );
    secp256k1_gej point;
    secp256k1_ge res;
    int i;

    secp256k1_gej_set_ge(&point, &secp256k1_ge_const_g);
    for (i = 0; i < 100; ++i) {
        secp256k1_ge tmp;
        secp256k1_ge_set_gej(&tmp, &point);
        secp256k1_ecmult_const(&point, &tmp, &scalar);
    }
    secp256k1_ge_set_gej(&res, &point);
    CHECK(secp256k1_gej_eq_ge_var(&expected_point, &res));
}